

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O0

uint reference_leading_zeros(uint64_t x)

{
  undefined4 local_14;
  uint64_t uStack_10;
  uint n;
  uint64_t x_local;
  
  local_14 = 0;
  for (uStack_10 = x; (uStack_10 & 0x8000000000000000) == 0; uStack_10 = uStack_10 << 1) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

unsigned int reference_leading_zeros(uint64_t x) {
    unsigned int n = 0;
    while (!(x & (static_cast<uint64_t>(0x1) << (sizeof(x)*8-1))))
    {
        ++n;
        x <<= 1;
    }
    return n;
}